

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O1

bool_t prf_model_vertex_palette_optimize(prf_model_t *model)

{
  uint8_t *__src;
  prf_vertex_pool_s **pppVar1;
  prf_vertex_pool_s *ppVar2;
  uint uVar3;
  void *__s;
  void *__ptr;
  uint *puVar4;
  uint8_t *puVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  bool_t bVar9;
  uint uVar10;
  ulong uVar11;
  uint16_t *uint16ptr;
  uint *__src_00;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  prf_cb_t callback;
  prf_cb_t callback_00;
  
  uVar8 = *(uint *)model->vertex_palette->data;
  if ((model->vertextras != (prf_vertex_pool_s **)0x0) &&
     (uVar3 = prf_array_count(model->vertextras), 0 < (int)uVar3)) {
    uVar7 = 0;
    do {
      uVar8 = uVar8 + model->vertextras[uVar7]->position;
      uVar7 = uVar7 + 1;
    } while (uVar3 != uVar7);
  }
  uVar7 = (ulong)uVar8;
  __s = malloc(uVar7);
  if (__s == (void *)0x0) {
    bVar9 = 0;
    prf_error(9,"memory allocation error (malloc returned NULL)");
  }
  else {
    memset(__s,0,uVar7);
    callback.data = __s;
    callback.func = vt_tag_cb;
    prf_model_traverse_io(model,callback);
    __ptr = malloc(uVar7);
    if (__ptr == (void *)0x0) {
      prf_error(9,"memory allocation error (malloc returned NULL)");
      free(__s);
    }
    else {
      puVar4 = (uint *)model->vertex_palette->data;
      uVar8 = *puVar4;
      uVar7 = 0;
      if (8 < uVar8) {
        __src_00 = puVar4 + 2;
        uVar7 = 0;
        lVar14 = 8;
        do {
          if (*(int *)((long)__s + lVar14) == 0) {
            uVar7 = (ulong)((int)uVar7 + (uint)*(ushort *)((long)__src_00 + 2));
          }
          else {
            memcpy((void *)((long)__ptr + (lVar14 - uVar7)),__src_00,
                   (ulong)*(ushort *)((long)__src_00 + 2));
            *(int *)((long)__s + lVar14) = (int)lVar14 - (int)uVar7;
          }
          __src_00 = (uint *)((long)__src_00 + (ulong)*(ushort *)((long)__src_00 + 2));
          lVar14 = (long)__src_00 - (long)puVar4;
        } while ((uint)lVar14 < uVar8);
      }
      iVar6 = (int)uVar7;
      uVar8 = *puVar4;
      if ((model->vertextras != (prf_vertex_pool_s **)0x0) &&
         (uVar3 = prf_array_count(model->vertextras), 0 < (int)uVar3)) {
        pppVar1 = model->vertextras;
        uVar11 = 0;
        do {
          ppVar2 = pppVar1[uVar11];
          uVar10 = ppVar2->position;
          if (uVar10 != 0) {
            puVar5 = ppVar2->data;
            uVar13 = 0;
            do {
              __src = puVar5 + uVar13;
              if (*(int *)((long)__s + uVar13 + uVar8) == 0) {
                uVar7 = (ulong)((int)uVar7 + (uint)*(ushort *)(__src + 2));
              }
              else {
                uVar10 = uVar8 + (int)uVar13;
                memcpy((void *)((long)__ptr + (uVar10 - uVar7)),__src,(ulong)*(ushort *)(__src + 2))
                ;
                *(uint *)((long)__s + (ulong)uVar10) = uVar10 - (int)uVar7;
              }
              uVar12 = (int)uVar13 + (uint)*(ushort *)(__src + 2);
              uVar13 = (ulong)uVar12;
              uVar10 = ppVar2->position;
            } while (uVar12 < uVar10);
          }
          iVar6 = (int)uVar7;
          uVar8 = uVar10 + uVar8;
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar3);
      }
      if (model->vertextras != (prf_vertex_pool_s **)0x0) {
        uVar3 = prf_array_count(model->vertextras);
        if (0 < (int)uVar3) {
          uVar7 = 0;
          do {
            free(model->vertextras[uVar7]->data);
            free(model->vertextras[uVar7]);
            uVar7 = uVar7 + 1;
          } while (uVar3 != uVar7);
        }
        prf_array_free(model->vertextras);
        model->vertextras = (prf_vertex_pool_s **)0x0;
      }
      uVar8 = uVar8 - iVar6;
      puVar4 = (uint *)model->vertex_palette->data;
      if (model->mempool_id == 0) {
        free(puVar4);
        puVar5 = (uint8_t *)realloc(__ptr,(ulong)uVar8);
        model->vertex_palette->data = puVar5;
      }
      else {
        if (*puVar4 < uVar8) {
          puVar4 = (uint *)pool_malloc(model->mempool_id,uVar8);
          model->vertex_palette->data = (uint8_t *)puVar4;
        }
        memcpy(puVar4,__ptr,(ulong)uVar8);
        free(__ptr);
      }
      *(uint *)model->vertex_palette->data = uVar8;
    }
    if (__ptr == (void *)0x0) {
      bVar9 = 0;
    }
    else {
      callback_00.data = __s;
      callback_00.func = vt_fix_cb;
      prf_model_traverse_io(model,callback_00);
      free(__s);
      bVar9 = 1;
    }
  }
  return bVar9;
}

Assistant:

bool_t
prf_model_vertex_palette_optimize(
    prf_model_t * model )
{
    prf_cb_t tag_cb, fix_cb;

    uint32_t length = 0;
    uint8_t * rlt = NULL;

    assert( model != NULL && model->vertex_palette != NULL );

    do { /* create vertex list pool */
        length = ((uint32_t *)(model->vertex_palette->data))[0];
        if ( model->vertextras != NULL ) {
            int i, count;
            count = prf_array_count( model->vertextras );
            for ( i = 0; i < count; i++ )
                length += model->vertextras[i]->position;
        }
        rlt = (uint8_t *)malloc( length );
        if ( rlt == NULL ) {
            prf_error( 9, "memory allocation error (malloc returned NULL)" );
            return FALSE;
        }
        memset( rlt, 0, length );
    } while ( FALSE );

    do { /* traverse and tag vertices */
        prf_cb_func( tag_cb, vt_tag_cb );
        prf_cb_data( tag_cb, rlt );
        prf_model_traverse_io( model, tag_cb );
    } while ( FALSE );

    do { /* compact vertex list and create reverse lookup table */
        uint32_t offset = 0;
        uint32_t datasize = 0;
        uint32_t orig_length = 0;
        uint8_t * ptr = NULL, * origdata = NULL;
        uint8_t * buffer = (uint8_t *)malloc( length );

        if ( buffer == NULL ) {
            prf_error( 9, "memory allocation error (malloc returned NULL)" );
            free( rlt );
            return FALSE;
        }

        origdata = model->vertex_palette->data;
        datasize = ((uint32_t *)(origdata))[0];
       
        /* node for node, check if tagged, and update move offset */
        ptr = origdata + 8;
        while ( ((unsigned int) (ptr - origdata)) < datasize ) {
            uint16_t * uint16ptr = (uint16_t *) ptr;
            if ( ((uint32_t *)(rlt+(ptr-origdata)))[0] != 0 ) {
                /* vertex is in use, move vertex into new buffer */
                memmove( buffer + (ptr-origdata) - offset, ptr, uint16ptr[1] );
                /* set reverse lookup index in rtl table */
                ((uint32_t *)(rlt+(ptr-origdata)))[0] = (ptr-origdata) - offset;
            } else {
                /* vertex not in use => accumulate offset */
                offset += uint16ptr[1]; /* add node length to offset */
            }
            ptr += uint16ptr[1];
        }
        orig_length = ((uint32_t *)(origdata))[0];
        if ( model->vertextras != NULL ) {
            int num, i;
            num = prf_array_count( model->vertextras );
            for ( i = 0; i < num; i++ ) {
                unsigned int pos = 0;
                prf_vertex_pool_t * pool = model->vertextras[i];
                while ( pos < pool->position ) {
                     uint16_t * uint16ptr = (uint16_t *) (pool->data + pos);
                     if ( ((uint32_t *)(rlt + orig_length + pos))[0] != 0 ) {
                         /* vertex in use, move vertex to buffer */
                         memmove( buffer + (orig_length + pos) - offset,
                             uint16ptr, uint16ptr[1] );
                         /* create reverse lookup */
                         ((uint32_t *)(rlt + (orig_length+pos)))[0] =
                                (orig_length+pos) - offset;
                     } else {
                         /* vertex not in use, accumulate offset */
                         offset += uint16ptr[1];
                     }
                     pos += uint16ptr[1];
                }
                orig_length += pool->position;
            }
        }

        /* move buffer back into model with vertextras */
        if ( model->vertextras != NULL ) {
            int i, count = prf_array_count( model->vertextras );
            for ( i = 0; i < count; i++ ) {
                free( model->vertextras[i]->data );
                free( model->vertextras[i] );
            }
            prf_array_free( model->vertextras );
            model->vertextras = NULL;
        }

        if ( model->mempool_id == 0 ) {
            free( model->vertex_palette->data );
            model->vertex_palette->data = 
	      (uint8_t *)realloc( buffer, orig_length-offset );
        } else {
            if ( ((uint32_t *)model->vertex_palette->data)[0] >=
                 (orig_length - offset) ) {
                memcpy( model->vertex_palette->data, buffer,
                    orig_length - offset );
            } else {
                /* some memory is wasted here until memory pool is freed */
	      model->vertex_palette->data = (uint8_t *)
                    pool_malloc( model->mempool_id, orig_length - offset );
                memcpy( model->vertex_palette->data, buffer,
                    orig_length - offset );
            }
            free( buffer );
        }
        ((uint32_t *)model->vertex_palette->data)[0] = orig_length - offset;
    } while ( FALSE );

    do { /* traverse and fix vertex list offsets */
        prf_cb_func( fix_cb, vt_fix_cb );
        prf_cb_data( fix_cb, rlt );
        prf_model_traverse_io( model, fix_cb );
        free( rlt );
    } while ( FALSE );

    return TRUE;
}